

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
single_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
             *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause)

{
  lock_guard<std::mutex> lVar1;
  pointer ptVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  undefined8 local_48;
  rep local_40;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  mbox_t *mbox_local;
  message_ref_t *msg_local;
  type_index *type_wrapper_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  duration pause_local;
  
  lock._M_device = (mutex_type *)mbox;
  std::lock_guard<std::mutex>::lock_guard(&local_38,&(this->m_sync_objects).m_lock);
  ptVar2 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
           operator->(&this->m_timer_manager);
  lVar1 = lock;
  local_40 = pause.__r;
  local_50 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_48,&local_50);
  (*ptVar2->_vptr_timer_manager_t[5])(ptVar2,type_wrapper,lVar1._M_device,msg,local_40,local_48);
  wakeup_if_waiting(&this->m_sync_objects);
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::single_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		m_timer_manager->schedule_anonymous(
				type_wrapper,
				mbox,
				msg,
				pause,
				std::chrono::milliseconds::zero() );

		wakeup_if_waiting( m_sync_objects );
	}